

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VdbeDelete(Vdbe *p)

{
  sqlite3 *db;
  Vdbe *pVVar1;
  Vdbe *pVVar2;
  Vdbe **ppVVar3;
  
  db = p->db;
  sqlite3VdbeClearObject(db,p);
  pVVar1 = p->pPrev;
  pVVar2 = p->pNext;
  ppVVar3 = &pVVar1->pNext;
  if (pVVar1 == (Vdbe *)0x0) {
    ppVVar3 = &db->pVdbe;
  }
  *ppVVar3 = pVVar2;
  if (pVVar2 != (Vdbe *)0x0) {
    pVVar2->pPrev = pVVar1;
  }
  p->magic = 0x5606c3c8;
  p->db = (sqlite3 *)0x0;
  sqlite3DbFreeNN(db,p);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeDelete(Vdbe *p){
  sqlite3 *db;

  assert( p!=0 );
  db = p->db;
  assert( sqlite3_mutex_held(db->mutex) );
  sqlite3VdbeClearObject(db, p);
  if( p->pPrev ){
    p->pPrev->pNext = p->pNext;
  }else{
    assert( db->pVdbe==p );
    db->pVdbe = p->pNext;
  }
  if( p->pNext ){
    p->pNext->pPrev = p->pPrev;
  }
  p->magic = VDBE_MAGIC_DEAD;
  p->db = 0;
  sqlite3DbFreeNN(db, p);
}